

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryWriter::writeImports(WasmBinaryWriter *this)

{
  LEB<unsigned_int,_unsigned_char> *pLVar1;
  pointer puVar2;
  Function *pFVar3;
  char *pcVar4;
  BufferWithRandomAccess *pBVar5;
  pointer puVar6;
  Global *pGVar7;
  pointer puVar8;
  Tag *pTVar9;
  pointer puVar10;
  Memory *pMVar11;
  Address AVar12;
  pointer puVar13;
  Table *pTVar14;
  int32_t start;
  Module *pMVar15;
  size_t in_RCX;
  pointer __n;
  pointer __n_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  iterator __end2_1;
  pointer puVar16;
  pointer puVar17;
  iterator __end2_3;
  iterator __begin2;
  pointer puVar18;
  pointer puVar19;
  pointer puVar20;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  iterator __end2;
  
  __end2._M_current._4_4_ =
       ImportInfo::getNumImports
                 ((this->importInfo)._M_t.
                  super___uniq_ptr_impl<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wasm::ImportInfo_*,_std::default_delete<wasm::ImportInfo>_>
                  .super__Head_base<0UL,_wasm::ImportInfo_*,_false>._M_head_impl);
  if (__end2._M_current._4_4_ != 0) {
    start = startSection<wasm::BinaryConsts::Section>(this,Import);
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)((long)&__end2._M_current + 4),(int)this->o,__buf
               ,in_RCX);
    pMVar15 = this->wasm;
    puVar18 = (pMVar15->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (pMVar15->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __n = puVar2;
    if (puVar18 != puVar2) {
      do {
        pFVar3 = (puVar18->_M_t).
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        pcVar4 = *(char **)((long)&(pFVar3->super_Importable).module + 8);
        if (pcVar4 != (char *)0x0) {
          name._M_str = pcVar4;
          name._M_len = (pFVar3->super_Importable).module.super_IString.str._M_len;
          writeInlineString(this,name);
          writeInlineString(this,*(string_view *)&(pFVar3->super_Importable).base);
          __end2._M_current._4_4_ = 0;
          pLVar1 = (LEB<unsigned_int,_unsigned_char> *)((long)&__end2._M_current + 4);
          LEB<unsigned_int,_unsigned_char>::write(pLVar1,(int)this->o,__buf_00,(size_t)__n);
          pBVar5 = this->o;
          __end2._M_current._4_4_ = getTypeIndex(this,(HeapType)(pFVar3->type).id);
          LEB<unsigned_int,_unsigned_char>::write(pLVar1,(int)pBVar5,__buf_01,(size_t)__n);
        }
        puVar18 = puVar18 + 1;
      } while (puVar18 != puVar2);
      pMVar15 = this->wasm;
    }
    puVar19 = (pMVar15->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (pMVar15->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar19 != puVar6) {
      pLVar1 = (LEB<unsigned_int,_unsigned_char> *)((long)&__end2._M_current + 4);
      do {
        pGVar7 = (puVar19->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        pcVar4 = *(char **)((long)&(pGVar7->super_Importable).module + 8);
        if (pcVar4 != (char *)0x0) {
          name_00._M_str = pcVar4;
          name_00._M_len = (pGVar7->super_Importable).module.super_IString.str._M_len;
          writeInlineString(this,name_00);
          writeInlineString(this,*(string_view *)&(pGVar7->super_Importable).base);
          __end2._M_current._4_4_ = 3;
          LEB<unsigned_int,_unsigned_char>::write(pLVar1,(int)this->o,__buf_02,(size_t)__n);
          writeType(this,(Type)(pGVar7->type).id);
          __end2._M_current._4_4_ = (Index)pGVar7->mutable_;
          LEB<unsigned_int,_unsigned_char>::write(pLVar1,(int)this->o,__buf_03,(size_t)__n);
        }
        puVar19 = puVar19 + 1;
      } while (puVar19 != puVar6);
      pMVar15 = this->wasm;
    }
    puVar20 = (pMVar15->tags).
              super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (pMVar15->tags).
             super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __n_00 = puVar8;
    if (puVar20 != puVar8) {
      do {
        pTVar9 = (puVar20->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                 _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                 super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
        pcVar4 = *(char **)((long)&(pTVar9->super_Importable).module + 8);
        if (pcVar4 != (char *)0x0) {
          name_01._M_str = pcVar4;
          name_01._M_len = (pTVar9->super_Importable).module.super_IString.str._M_len;
          writeInlineString(this,name_01);
          writeInlineString(this,*(string_view *)&(pTVar9->super_Importable).base);
          __end2._M_current._4_4_ = 4;
          pLVar1 = (LEB<unsigned_int,_unsigned_char> *)((long)&__end2._M_current + 4);
          LEB<unsigned_int,_unsigned_char>::write(pLVar1,(int)this->o,__buf_04,(size_t)__n_00);
          __end2._M_current._4_4_ = __end2._M_current._4_4_ & 0xffffff00;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                     (uchar *)pLVar1);
          pBVar5 = this->o;
          __end2._M_current._4_4_ = getTypeIndex(this,(HeapType)(pTVar9->type).id);
          LEB<unsigned_int,_unsigned_char>::write(pLVar1,(int)pBVar5,__buf_05,(size_t)__n_00);
        }
        puVar20 = puVar20 + 1;
      } while (puVar20 != puVar8);
      pMVar15 = this->wasm;
    }
    puVar16 = (pMVar15->memories).
              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar10 = (pMVar15->memories).
              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar16 != puVar10) {
      do {
        pMVar11 = (puVar16->_M_t).
                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
        pcVar4 = *(char **)((long)&(pMVar11->super_Importable).module + 8);
        if (pcVar4 != (char *)0x0) {
          name_02._M_str = pcVar4;
          name_02._M_len = (pMVar11->super_Importable).module.super_IString.str._M_len;
          writeInlineString(this,name_02);
          writeInlineString(this,*(string_view *)&(pMVar11->super_Importable).base);
          __end2._M_current._4_4_ = 2;
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)((long)&__end2._M_current + 4),(int)this->o
                     ,__buf_06,(size_t)__n_00);
          AVar12.addr = (pMVar11->max).addr;
          __n_00 = (pointer)(ulong)(AVar12.addr != 0xffffffffffffffff);
          writeResizableLimits
                    (this,(Address)(pMVar11->initial).addr,AVar12,AVar12.addr != 0xffffffffffffffff,
                     pMVar11->shared,(pMVar11->addressType).id == 3);
        }
        puVar16 = puVar16 + 1;
      } while (puVar16 != puVar10);
      pMVar15 = this->wasm;
    }
    puVar13 = (pMVar15->tables).
              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar17 = (pMVar15->tables).
                   super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar13;
        puVar17 = puVar17 + 1) {
      pTVar14 = (puVar17->_M_t).
                super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      pcVar4 = *(char **)((long)&(pTVar14->super_Importable).module + 8);
      if (pcVar4 != (char *)0x0) {
        name_03._M_str = pcVar4;
        name_03._M_len = (pTVar14->super_Importable).module.super_IString.str._M_len;
        writeInlineString(this,name_03);
        writeInlineString(this,*(string_view *)&(pTVar14->super_Importable).base);
        __end2._M_current._4_4_ = 1;
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)((long)&__end2._M_current + 4),(int)this->o,
                   __buf_07,(size_t)__n_00);
        writeType(this,(Type)(pTVar14->type).id);
        AVar12.addr = (pTVar14->max).addr;
        __n_00 = (pointer)(ulong)(AVar12.addr != 0xffffffff);
        writeResizableLimits
                  (this,(Address)(pTVar14->initial).addr,AVar12,AVar12.addr != 0xffffffff,false,
                   (pTVar14->addressType).id == 3);
      }
    }
    finishSection(this,start);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeImports() {
  auto num = importInfo->getNumImports();
  if (num == 0) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::Import);
  o << U32LEB(num);
  auto writeImportHeader = [&](Importable* import) {
    writeInlineString(import->module.str);
    writeInlineString(import->base.str);
  };
  ModuleUtils::iterImportedFunctions(*wasm, [&](Function* func) {
    writeImportHeader(func);
    o << U32LEB(int32_t(ExternalKind::Function));
    o << U32LEB(getTypeIndex(func->type));
  });
  ModuleUtils::iterImportedGlobals(*wasm, [&](Global* global) {
    writeImportHeader(global);
    o << U32LEB(int32_t(ExternalKind::Global));
    writeType(global->type);
    o << U32LEB(global->mutable_);
  });
  ModuleUtils::iterImportedTags(*wasm, [&](Tag* tag) {
    writeImportHeader(tag);
    o << U32LEB(int32_t(ExternalKind::Tag));
    o << uint8_t(0); // Reserved 'attribute' field. Always 0.
    o << U32LEB(getTypeIndex(tag->type));
  });
  ModuleUtils::iterImportedMemories(*wasm, [&](Memory* memory) {
    writeImportHeader(memory);
    o << U32LEB(int32_t(ExternalKind::Memory));
    writeResizableLimits(memory->initial,
                         memory->max,
                         memory->hasMax(),
                         memory->shared,
                         memory->is64());
  });
  ModuleUtils::iterImportedTables(*wasm, [&](Table* table) {
    writeImportHeader(table);
    o << U32LEB(int32_t(ExternalKind::Table));
    writeType(table->type);
    writeResizableLimits(table->initial,
                         table->max,
                         table->hasMax(),
                         /*shared=*/false,
                         table->is64());
  });
  finishSection(start);
}